

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcTransportElementType::IfcTransportElementType
          (IfcTransportElementType *this)

{
  *(undefined ***)&this->field_0x1b0 = &PTR__Object_00816a50;
  *(undefined8 *)&this->field_0x1b8 = 0;
  *(char **)&this->field_0x1c0 = "IfcTransportElementType";
  IfcElementType::IfcElementType(&this->super_IfcElementType,&PTR_construction_vtable_24__008b6ca8);
  *(undefined8 *)&(this->super_IfcElementType).field_0x188 = 0;
  *(undefined8 *)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject = 0x8b6ba0;
  *(undefined8 *)&this->field_0x1b0 = 0x8b6c90;
  *(undefined8 *)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.field_0x88 =
       0x8b6bc8;
  (this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x8b6bf0;
  *(undefined8 *)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.field_0xf0 =
       0x8b6c18;
  *(undefined8 *)&(this->super_IfcElementType).super_IfcTypeProduct.field_0x148 = 0x8b6c40;
  *(undefined8 *)&(this->super_IfcElementType).field_0x180 = 0x8b6c68;
  *(undefined1 **)&(this->super_IfcElementType).field_0x190 = &this->field_0x1a0;
  *(undefined8 *)&this->field_0x198 = 0;
  this->field_0x1a0 = 0;
  return;
}

Assistant:

IfcTransportElementType() : Object("IfcTransportElementType") {}